

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

int If_CluHasVar(word *t,int nVars,int iVar)

{
  int iVar1;
  int iVar2;
  int local_34;
  int Step;
  int k;
  int i_1;
  int Shift;
  int i;
  int nWords;
  int iVar_local;
  int nVars_local;
  word *t_local;
  
  iVar1 = If_CluWordNum(nVars);
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x5c1,"int If_CluHasVar(word *, int, int)");
  }
  if (iVar < 6) {
    for (i_1 = 0; i_1 < iVar1; i_1 = i_1 + 1) {
      if ((t[i_1] & (Truth6[iVar] ^ 0xffffffffffffffff)) !=
          (t[i_1] & Truth6[iVar]) >> ((byte)(1 << ((byte)iVar & 0x1f)) & 0x3f)) {
        return 1;
      }
    }
  }
  else {
    iVar2 = 1 << ((byte)iVar - 6 & 0x1f);
    _iVar_local = t;
    for (local_34 = 0; local_34 < iVar1; local_34 = iVar2 * 2 + local_34) {
      for (Step = 0; Step < iVar2; Step = Step + 1) {
        if (_iVar_local[Step] != _iVar_local[iVar2 + Step]) {
          return 1;
        }
      }
      _iVar_local = _iVar_local + (iVar2 << 1);
    }
  }
  return 0;
}

Assistant:

static inline int If_CluHasVar( word * t, int nVars, int iVar )
{
    int nWords = If_CluWordNum( nVars );
    assert( iVar < nVars );
    if ( iVar < 6 )
    {
        int i, Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            if ( (t[i] & ~Truth6[iVar]) != ((t[i] & Truth6[iVar]) >> Shift) )
                return 1;
        return 0;
    }
    else
    {
        int i, k, Step = (1 << (iVar - 6));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                if ( t[i] != t[Step+i] )
                    return 1;
            t += 2*Step;
        }
        return 0;
    }
}